

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O2

void __thiscall CVmImageLoader::save_synth_exports(CVmImageLoader *this,CVmFile *fp)

{
  long seekpos;
  long seekpos_00;
  synth_save_cb_ctx ctx;
  CVmFile *local_30;
  undefined8 local_28;
  
  local_28 = 0;
  local_30 = fp;
  seekpos = CVmFile::get_pos(fp);
  CVmFile::write_uint4(fp,0);
  CVmHashTable::enum_entries(this->synth_exports_,save_synth_export_cb,&local_30);
  seekpos_00 = CVmFile::get_pos(fp);
  CVmFile::set_pos(fp,seekpos);
  CVmFile::write_uint4(fp,(uint)local_28);
  CVmFile::set_pos(fp,seekpos_00);
  return;
}

Assistant:

void CVmImageLoader::save_synth_exports(VMG_ CVmFile *fp)
{
    synth_save_cb_ctx ctx;
    long pos;
    long end_pos;

    /* set up our context */
    ctx.fp = fp;
    ctx.cnt = 0;

    /* 
     *   write a placeholder count of zero, but remember where it is so we
     *   can come back and fix it up later 
     */
    pos = fp->get_pos();
    fp->write_uint4(0);

    /* enumerate all of the entries through our save callback */
    synth_exports_->enum_entries(&save_synth_export_cb, &ctx);

    /* go back and fix up the count, then seek back to the end */
    end_pos = fp->get_pos();
    fp->set_pos(pos);
    fp->write_uint4(ctx.cnt);
    fp->set_pos(end_pos);
}